

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  uint uVar1;
  U32 matchLength_00;
  ZSTD_compressedBlockState_t *pZVar2;
  BYTE *pBVar3;
  U32 offset;
  uint uVar4;
  size_t code;
  BYTE *dst;
  ulong uVar5;
  bool bVar6;
  repcodes_t rVar7;
  size_t err_code;
  U32 local_110;
  U32 offCode;
  U32 ll0;
  U32 matchLength;
  U32 litLength;
  U32 dictSize;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  U32 idx;
  size_t blockSize_local;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  ZSTD_sequencePosition *seqPos_local;
  ZSTD_CCtx *cctx_local;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  ip._4_4_ = seqPos->idx;
  updatedRepcodes.rep._4_8_ = (long)src + blockSize;
  if (cctx->cdict == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      matchLength = 0;
    }
    else {
      matchLength = (U32)(cctx->prefixDict).dictSize;
    }
  }
  else {
    matchLength = (U32)cctx->cdict->dictContentSize;
  }
  pZVar2 = (cctx->blockState).prevCBlock;
  _litLength = *(size_t *)pZVar2->rep;
  updatedRepcodes.rep[0] = pZVar2->rep[2];
  iend = (BYTE *)src;
  while( true ) {
    if ((inSeqs[ip._4_4_].matchLength != 0) || (bVar6 = false, inSeqs[ip._4_4_].offset != 0)) {
      bVar6 = ip._4_4_ < inSeqsSize;
    }
    if (!bVar6) {
      pZVar2 = (cctx->blockState).nextCBlock;
      *(size_t *)pZVar2->rep = _litLength;
      pZVar2->rep[2] = updatedRepcodes.rep[0];
      if (inSeqs[ip._4_4_].litLength != 0) {
        ZSTD_storeLastLiterals(&cctx->seqStore,iend,(ulong)inSeqs[ip._4_4_].litLength);
        iend = iend + inSeqs[ip._4_4_].litLength;
        seqPos->posInSrc = (ulong)inSeqs[ip._4_4_].litLength + seqPos->posInSrc;
      }
      if (iend != (BYTE *)updatedRepcodes.rep._4_8_) {
        return 0xffffffffffffffec;
      }
      seqPos->idx = ip._4_4_ + 1;
      return 0;
    }
    uVar1 = inSeqs[ip._4_4_].litLength;
    matchLength_00 = inSeqs[ip._4_4_].matchLength;
    offset = ZSTD_finalizeOffCode(inSeqs[ip._4_4_].offset,&litLength,(uint)(uVar1 == 0));
    rVar7 = ZSTD_updateRep(&litLength,offset,(uint)(uVar1 == 0));
    err_code = rVar7.rep._0_8_;
    local_110 = rVar7.rep[2];
    _litLength = err_code;
    updatedRepcodes.rep[0] = local_110;
    if ((cctx->appliedParams).validateSequences != 0) {
      seqPos->posInSrc = (ulong)(uVar1 + matchLength_00) + seqPos->posInSrc;
      code = ZSTD_validateSequence
                       (offset,matchLength_00,seqPos->posInSrc,
                        (cctx->appliedParams).cParams.windowLog,(ulong)matchLength,
                        (cctx->appliedParams).cParams.minMatch);
      uVar4 = ERR_isError(code);
      if (uVar4 != 0) {
        return code;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(ip._4_4_ - seqPos->idx)) break;
    uVar5 = (ulong)uVar1;
    if ((BYTE *)(updatedRepcodes.rep._4_8_ + -0x20) < iend + uVar5) {
      ZSTD_safecopyLiterals
                ((cctx->seqStore).lit,iend,iend + uVar5,(BYTE *)(updatedRepcodes.rep._4_8_ + -0x20))
      ;
    }
    else {
      ZSTD_copy16((cctx->seqStore).lit,iend);
      if (0x10 < uVar5) {
        pBVar3 = (cctx->seqStore).lit;
        dst = pBVar3 + 0x10;
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar5 - 0x10)) {
          oend = pBVar3 + 0x20;
          pBVar3 = iend;
          do {
            op = pBVar3 + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,pBVar3 + 0x30);
            oend = oend + 0x20;
            pBVar3 = op;
          } while (oend < dst + (uVar5 - 0x10));
        }
      }
    }
    (cctx->seqStore).lit = (cctx->seqStore).lit + uVar5;
    if (0xffff < uVar5) {
      (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->litLength = (U16)uVar1;
    ((cctx->seqStore).sequences)->offset = offset + 1;
    if (0xffff < matchLength_00 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->matchLength = (U16)(matchLength_00 - 3);
    (cctx->seqStore).sequences = (cctx->seqStore).sequences + 1;
    iend = iend + (matchLength_00 + uVar1);
    ip._4_4_ = ip._4_4_ + 1;
  }
  return 0xffffffffffffffc0;
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                             const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                             const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;
    U32 litLength;
    U32 matchLength;
    U32 ll0;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0) && idx < inSeqsSize; ++idx) {
        litLength = inSeqs[idx].litLength;
        matchLength = inSeqs[idx].matchLength;
        ll0 = litLength == 0;
        offCode = ZSTD_finalizeOffCode(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize,
                                                cctx->appliedParams.cParams.minMatch),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, corruption_detected, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}